

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

bool __thiscall leveldb::anon_unknown_0::LRUCache::FinishErase(LRUCache *this,LRUHandle *e)

{
  LRUHandle *pLVar1;
  LRUHandle *pLVar2;
  
  if (e != (LRUHandle *)0x0) {
    if (e->in_cache == false) {
      __assert_fail("e->in_cache",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/util/cache.cc"
                    ,0x136,"bool leveldb::(anonymous namespace)::LRUCache::FinishErase(LRUHandle *)"
                   );
    }
    pLVar1 = e->next;
    pLVar2 = e->prev;
    pLVar1->prev = pLVar2;
    pLVar2->next = pLVar1;
    e->in_cache = false;
    this->usage_ = this->usage_ - e->charge;
    Unref(this,e);
  }
  return e != (LRUHandle *)0x0;
}

Assistant:

bool LRUCache::FinishErase(LRUHandle* e) {
  if (e != nullptr) {
    assert(e->in_cache);
    LRU_Remove(e);
    e->in_cache = false;
    usage_ -= e->charge;
    Unref(e);
  }
  return e != nullptr;
}